

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O0

size_t __thiscall BamTools::Internal::BgzfStream::DeflateBlock(BgzfStream *this,int32_t blockLength)

{
  undefined8 uVar1;
  BamException *this_00;
  uint in_ESI;
  long in_RDI;
  int remaining;
  uint32_t crc;
  int status;
  z_stream zs;
  uint bufferSize;
  size_t compressedLength;
  int inputLength;
  int compressionLevel;
  char *buffer;
  string *in_stack_fffffffffffffcf0;
  string *psVar2;
  string *in_stack_fffffffffffffcf8;
  BamException *in_stack_fffffffffffffd00;
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [36];
  int local_24c;
  uint local_248;
  undefined1 local_242;
  allocator local_241;
  string local_240 [39];
  undefined1 local_219 [39];
  undefined1 local_1f2;
  undefined1 local_1f1 [40];
  allocator local_1c9;
  string local_1c8 [38];
  undefined1 local_1a2;
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [38];
  undefined1 local_152;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [38];
  undefined1 local_102;
  allocator local_101;
  string local_100 [55];
  allocator local_c9;
  string local_c8 [36];
  int local_a4;
  undefined8 local_a0;
  uint local_98;
  undefined1 *local_88;
  undefined4 local_80;
  long local_78;
  undefined8 local_60;
  undefined8 local_58;
  undefined4 local_2c;
  ulong local_28;
  uint local_20;
  undefined4 local_1c;
  undefined1 *local_18;
  uint local_c;
  
  local_18 = *(undefined1 **)(in_RDI + 0x30);
  local_c = in_ESI;
  memset(local_18,0,0x12);
  *local_18 = 0x1f;
  local_18[1] = 0x8b;
  local_18[2] = 8;
  local_18[3] = 4;
  local_18[9] = 0xff;
  local_18[10] = 6;
  local_18[0xc] = 0x42;
  local_18[0xd] = 0x43;
  local_18[0xe] = 2;
  local_1c = 0;
  if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
    local_1c = 0xffffffff;
  }
  local_20 = local_c;
  local_28 = 0;
  local_2c = 0x10000;
  do {
    local_60 = 0;
    local_58 = 0;
    local_a0 = *(undefined8 *)(in_RDI + 0x20);
    local_98 = local_20;
    local_88 = local_18 + 0x12;
    local_80 = 0xffe6;
    local_a4 = deflateInit2_(&local_a0,local_1c,8,0xfffffff1,8,0,"1.2.11",0x70);
    if (local_a4 != 0) {
      local_102 = 1;
      uVar1 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"BgzfStream::DeflateBlock",&local_c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"zlib deflateInit2 failed",&local_101);
      BamException::BamException
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      local_102 = 0;
      __cxa_throw(uVar1,&BamException::typeinfo,BamException::~BamException);
    }
    local_a4 = deflate(&local_a0,4);
    if (local_a4 == 1) {
      local_a4 = deflateEnd(&local_a0);
      if (local_a4 != 0) {
        local_1f2 = 1;
        this_00 = (BamException *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c8,"BgzfStream::DeflateBlock",&local_1c9);
        psVar2 = (string *)local_1f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_1f1 + 1),"zlib deflateEnd failed",(allocator *)psVar2);
        BamException::BamException(this_00,psVar2,in_stack_fffffffffffffcf0);
        local_1f2 = 0;
        __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
      }
      local_28 = local_78 + 0x1a;
      if (local_28 < 0x10001) {
        PackUnsignedShort(local_18 + 0x10,(short)local_28 - 1);
        local_248 = crc32(0,0,0);
        local_248 = crc32(local_248,*(undefined8 *)(in_RDI + 0x20),local_20);
        PackUnsignedInt(local_18 + (local_28 - 8),local_248);
        PackUnsignedInt(local_18 + (local_28 - 4),local_20);
        local_24c = local_c - local_20;
        if (0 < local_24c) {
          if ((int)local_20 < local_24c) {
            uVar1 = __cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_270,"BgzfStream::DeflateBlock",&local_271);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_298,"after deflate, remainder too large",&local_299);
            BamException::BamException
                      (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0
                      );
            __cxa_throw(uVar1,&BamException::typeinfo,BamException::~BamException);
          }
          memcpy(*(void **)(in_RDI + 0x20),(void *)(*(long *)(in_RDI + 0x20) + (long)(int)local_20),
                 (long)local_24c);
        }
        *(int *)(in_RDI + 4) = local_24c;
        return local_28;
      }
      local_242 = 1;
      uVar1 = __cxa_allocate_exception(0x28);
      psVar2 = (string *)local_219;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_219 + 1),"BgzfStream::DeflateBlock",(allocator *)psVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_240,"deflate overflow",&local_241);
      BamException::BamException(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,psVar2);
      local_242 = 0;
      __cxa_throw(uVar1,&BamException::typeinfo,BamException::~BamException);
    }
    deflateEnd(&local_a0);
    if (local_a4 != 0) {
      local_1a2 = 1;
      uVar1 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,"BgzfStream::DeflateBlock",&local_179);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a0,"zlib deflate failed",&local_1a1);
      BamException::BamException
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      local_1a2 = 0;
      __cxa_throw(uVar1,&BamException::typeinfo,BamException::~BamException);
    }
    local_20 = local_20 - 0x400;
  } while (-1 < (int)local_20);
  local_152 = 1;
  uVar1 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"BgzfStream::DeflateBlock",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"input reduction failed",&local_151);
  BamException::BamException
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  local_152 = 0;
  __cxa_throw(uVar1,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

std::size_t BgzfStream::DeflateBlock(int32_t blockLength)
{

    // initialize the gzip header
    char* buffer = m_compressedBlock.Buffer;
    memset(buffer, 0, 18);
    buffer[0] = Constants::GZIP_ID1;
    buffer[1] = Constants::GZIP_ID2;
    buffer[2] = Constants::CM_DEFLATE;
    buffer[3] = Constants::FLG_FEXTRA;
    buffer[9] = Constants::OS_UNKNOWN;
    buffer[10] = Constants::BGZF_XLEN;
    buffer[12] = Constants::BGZF_ID1;
    buffer[13] = Constants::BGZF_ID2;
    buffer[14] = Constants::BGZF_LEN;

    // set compression level
    const int compressionLevel = (m_isWriteCompressed ? Z_DEFAULT_COMPRESSION : 0);

    // loop to retry for blocks that do not compress enough
    int inputLength = blockLength;
    std::size_t compressedLength = 0;
    const unsigned int bufferSize = Constants::BGZF_MAX_BLOCK_SIZE;

    while (true) {

        // initialize zstream values
        z_stream zs;
        zs.zalloc = NULL;
        zs.zfree = NULL;
        zs.next_in = (Bytef*)m_uncompressedBlock.Buffer;
        zs.avail_in = inputLength;
        zs.next_out = (Bytef*)&buffer[Constants::BGZF_BLOCK_HEADER_LENGTH];
        zs.avail_out =
            bufferSize - Constants::BGZF_BLOCK_HEADER_LENGTH - Constants::BGZF_BLOCK_FOOTER_LENGTH;

        // initialize the zlib compression algorithm
        int status = deflateInit2(&zs, compressionLevel, Z_DEFLATED, Constants::GZIP_WINDOW_BITS,
                                  Constants::Z_DEFAULT_MEM_LEVEL, Z_DEFAULT_STRATEGY);
        if (status != Z_OK)
            throw BamException("BgzfStream::DeflateBlock", "zlib deflateInit2 failed");

        // compress the data
        status = deflate(&zs, Z_FINISH);

        // if not at stream end
        if (status != Z_STREAM_END) {

            deflateEnd(&zs);

            // there was not enough space available in buffer
            // try to reduce the input length & re-start loop
            if (status == Z_OK) {
                inputLength -= 1024;
                if (inputLength < 0)
                    throw BamException("BgzfStream::DeflateBlock", "input reduction failed");
                continue;
            }

            throw BamException("BgzfStream::DeflateBlock", "zlib deflate failed");
        }

        // finalize the compression routine
        status = deflateEnd(&zs);
        if (status != Z_OK)
            throw BamException("BgzfStream::DeflateBlock", "zlib deflateEnd failed");

        // update compressedLength
        compressedLength = zs.total_out + Constants::BGZF_BLOCK_HEADER_LENGTH +
                           Constants::BGZF_BLOCK_FOOTER_LENGTH;
        if (compressedLength > Constants::BGZF_MAX_BLOCK_SIZE)
            throw BamException("BgzfStream::DeflateBlock", "deflate overflow");

        // quit while loop
        break;
    }

    // store the compressed length
    BamTools::PackUnsignedShort(&buffer[16], static_cast<uint16_t>(compressedLength - 1));

    // store the CRC32 checksum
    uint32_t crc = crc32(0, NULL, 0);
    crc = crc32(crc, (Bytef*)m_uncompressedBlock.Buffer, inputLength);
    BamTools::PackUnsignedInt(&buffer[compressedLength - 8], crc);
    BamTools::PackUnsignedInt(&buffer[compressedLength - 4], inputLength);

    // ensure that we have less than a block of data left
    int remaining = blockLength - inputLength;
    if (remaining > 0) {
        if (remaining > inputLength)
            throw BamException("BgzfStream::DeflateBlock", "after deflate, remainder too large");
        memcpy(m_uncompressedBlock.Buffer, m_uncompressedBlock.Buffer + inputLength, remaining);
    }

    // update block data
    m_blockOffset = remaining;

    // return result
    return compressedLength;
}